

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O1

void __thiscall midi_container::trim_start(midi_container *this)

{
  pointer pmVar1;
  pointer pmVar2;
  long lVar3;
  unsigned_long start;
  
  pmVar1 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pmVar2 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->m_form == 2) {
    lVar3 = (long)pmVar1 - (long)pmVar2;
    if (lVar3 != 0) {
      lVar3 = (lVar3 >> 3) * -0x5555555555555555;
      start = 0;
      do {
        trim_range_of_tracks(this,start,start);
        start = start + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != start);
    }
    return;
  }
  trim_range_of_tracks(this,0,((long)pmVar1 - (long)pmVar2 >> 3) * -0x5555555555555555 - 1);
  return;
}

Assistant:

void midi_container::trim_start()
{
    if (m_form == 2)
    {
        for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
        {
            trim_range_of_tracks(i, i);
        }
    }
    else
    {
        trim_range_of_tracks(0, m_tracks.size() - 1);
    }
}